

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::check_string_literal(parser *this,source_extend *extend)

{
  bool bVar1;
  wchar_t *in_R9;
  wstring_view wVar2;
  wstring_view message;
  wstring local_1e0 [32];
  undefined1 local_1c0 [16];
  wostringstream local_1a0 [8];
  wostringstream _oss;
  mjs *local_28;
  source_extend *extend_local;
  parser *this_local;
  
  wVar2 = source_extend::source_view(extend);
  local_28 = (mjs *)wVar2._M_len;
  wVar2._M_len = (size_t)wVar2._M_str;
  bVar1 = has_octal_escape_sequence(local_28,wVar2);
  if (!bVar1) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream(local_1a0);
  std::operator<<((wostream *)local_1a0,"Octal escape sequences may not be used in strict mode");
  std::__cxx11::wostringstream::str();
  local_1c0 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1e0);
  message._M_str = in_R9;
  message._M_len = local_1c0._8_8_;
  syntax_error((parser *)"check_string_literal",(char *)0x1a1,(int)extend,local_1c0._0_8_,message);
}

Assistant:

void check_string_literal(const source_extend& extend) {
        if (has_octal_escape_sequence(extend.source_view())) {
            SYNTAX_ERROR_AT("Octal escape sequences may not be used in strict mode", extend);
        }
    }